

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

int __thiscall
glslang::TDefaultIoResolver::resolveBinding
          (TDefaultIoResolver *this,EShLanguage stage,TVarEntryInfo *ent)

{
  char cVar1;
  int iVar2;
  TResourceType res;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  uint set;
  long *plVar4;
  
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
  set = 0;
  if ((*(uint *)(lVar5 + 0x1c) & 0x3f8000) != 0x1f8000) {
    lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
    set = *(uint *)(lVar5 + 0x1c) >> 0xf & 0x7f;
  }
  iVar2 = 1;
  if ((((this->super_TDefaultIoResolverBase).referenceIntermediate)->spvVersion).openGl != 0) {
    cVar1 = (**(code **)(*plVar4 + 0xf0))(plVar4);
    if (cVar1 != '\0') {
      iVar2 = (**(code **)(*plVar4 + 0x88))(plVar4);
    }
  }
  res = (*(this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[0x15])
                  (this,plVar4);
  iVar3 = -1;
  if ((int)res < 6) {
    lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
    if ((short)((ulong)*(undefined8 *)(lVar5 + 0x1c) >> 0x20) == -1) {
      if ((ent->live == true) &&
         (((this->super_TDefaultIoResolverBase).referenceIntermediate)->autoMapBindings == true)) {
        iVar3 = TDefaultIoResolverBase::getBaseBinding
                          (&this->super_TDefaultIoResolverBase,stage,res,set);
        iVar3 = TDefaultIoResolverBase::getFreeSlot
                          (&this->super_TDefaultIoResolverBase,set,iVar3,iVar2);
      }
    }
    else {
      iVar3 = TDefaultIoResolverBase::getBaseBinding
                        (&this->super_TDefaultIoResolverBase,stage,res,set);
      lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
      iVar3 = (uint)*(ushort *)(lVar5 + 0x20) + iVar3;
      TDefaultIoResolverBase::reserveSlot(&this->super_TDefaultIoResolverBase,set,iVar3,iVar2);
    }
  }
  ent->newBinding = iVar3;
  return iVar3;
}

Assistant:

int resolveBinding(EShLanguage stage, TVarEntryInfo& ent) override {
        const TType& type = ent.symbol->getType();
        const int set = getLayoutSet(type);
        // On OpenGL arrays of opaque types take a seperate binding for each element
        int numBindings = referenceIntermediate.getSpv().openGl != 0 && type.isSizedArray() ? type.getCumulativeArraySize() : 1;
        TResourceType resource = getResourceType(type);
        if (resource < EResCount) {
            if (type.getQualifier().hasBinding()) {
                return ent.newBinding = reserveSlot(
                           set, getBaseBinding(stage, resource, set) + type.getQualifier().layoutBinding, numBindings);
            } else if (ent.live && doAutoBindingMapping()) {
                // find free slot, the caller did make sure it passes all vars with binding
                // first and now all are passed that do not have a binding and needs one
                return ent.newBinding = getFreeSlot(set, getBaseBinding(stage, resource, set), numBindings);
            }
        }
        return ent.newBinding = -1;
    }